

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O3

void __thiscall Js::ScriptFunction::InvalidateCachedScopeChain(ScriptFunction *this)

{
  ushort uVar1;
  ActivationObjectEx *this_00;
  FrameDisplay *this_01;
  void *aValue;
  RecyclableObject *pRVar2;
  uint index;
  
  this_00 = (this->cachedScopeObj).ptr;
  if (this_00 != (ActivationObjectEx *)0x0) {
    ActivationObjectEx::InvalidateCachedScope(this_00);
  }
  this_01 = (this->environment).ptr;
  uVar1 = this_01->length;
  if (uVar1 != 0) {
    index = 0;
    do {
      aValue = FrameDisplay::GetItem(this_01,index);
      pRVar2 = VarTo<Js::RecyclableObject>(aValue);
      (*(pRVar2->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
        [0x59])(pRVar2);
      index = index + 1;
    } while (uVar1 != index);
  }
  return;
}

Assistant:

void ScriptFunction::InvalidateCachedScopeChain()
    {
        // Note: Currently this helper assumes that we're in an eval-class case
        // where all the contents of the closure environment are dynamic objects.
        // Invalidating scopes that are raw slot arrays, etc., will have to be done
        // directly in byte code.

        // A function nested within this one has escaped.
        // Invalidate our own cached scope object, and walk the closure environment
        // doing this same.
        if (this->cachedScopeObj)
        {
            this->cachedScopeObj->InvalidateCachedScope();
        }
        FrameDisplay *pDisplay = this->environment;
        uint length = (uint)pDisplay->GetLength();
        for (uint i = 0; i < length; i++)
        {
            Var scope = pDisplay->GetItem(i);
            RecyclableObject *scopeObj = VarTo<RecyclableObject>(scope);
            scopeObj->InvalidateCachedScope();
        }
    }